

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

BinsSelectConditionExprSyntax * __thiscall
slang::parsing::Parser::parseBinsSelectPrimary::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this)

{
  Token intersect_00;
  Token openParen_00;
  Token binsof_00;
  bool bVar1;
  ParserBase *this_00;
  BinsSelectConditionExprSyntax *pBVar2;
  undefined8 *in_RDI;
  Token TVar3;
  Token closeParen_00;
  Token TVar4;
  Parser *in_stack_00000018;
  RangeListSyntax *ranges;
  Token intersect;
  IntersectClauseSyntax *intersectClause;
  Token closeParen;
  NameSyntax *name;
  Token openParen;
  Token binsof;
  RangeListSyntax *in_stack_ffffffffffffff38;
  Parser *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff48;
  TokenKind in_stack_ffffffffffffff4e;
  ParserBase *in_stack_ffffffffffffff50;
  undefined8 uVar5;
  ParserBase *in_stack_ffffffffffffff60;
  undefined8 local_48;
  undefined8 local_40;
  TokenKind kind;
  ParserBase *in_stack_ffffffffffffffd0;
  undefined8 local_18;
  
  uVar5 = *in_RDI;
  TVar3 = ParserBase::expect(in_stack_ffffffffffffffd0,kind);
  closeParen_00 = ParserBase::expect(in_stack_ffffffffffffffd0,kind);
  this_00 = (ParserBase *)parseName(in_stack_ffffffffffffff40);
  TVar4 = ParserBase::expect(this_00,kind);
  local_48 = (IntersectClauseSyntax *)0x0;
  bVar1 = ParserBase::peek(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4e);
  if (bVar1) {
    ParserBase::consume(in_stack_ffffffffffffff60);
    parseRangeList(in_stack_00000018);
    intersect_00.rawLen._2_2_ = in_stack_ffffffffffffff4e;
    intersect_00._0_6_ = in_stack_ffffffffffffff48;
    intersect_00.info = (Info *)in_stack_ffffffffffffff50;
    local_48 = slang::syntax::SyntaxFactory::intersectClause
                         ((SyntaxFactory *)in_stack_ffffffffffffff40,intersect_00,
                          in_stack_ffffffffffffff38);
  }
  local_18 = TVar3._0_8_;
  local_40 = TVar4._0_8_;
  binsof_00.info = local_40;
  binsof_00.kind = (short)uVar5;
  binsof_00._2_1_ = (char)((ulong)uVar5 >> 0x10);
  binsof_00.numFlags.raw = (char)((ulong)uVar5 >> 0x18);
  binsof_00.rawLen = (int)((ulong)uVar5 >> 0x20);
  openParen_00.info = (Info *)in_stack_ffffffffffffff50;
  openParen_00._0_8_ = local_48;
  pBVar2 = slang::syntax::SyntaxFactory::binsSelectConditionExpr
                     ((SyntaxFactory *)TVar4.info,binsof_00,openParen_00,(NameSyntax *)local_40,
                      closeParen_00,local_18);
  return pBVar2;
}

Assistant:

BinsSelectExpressionSyntax& Parser::parseBinsSelectPrimary() {
    auto parseCondition = [&]() -> BinsSelectConditionExprSyntax& {
        auto binsof = expect(TokenKind::BinsOfKeyword);
        auto openParen = expect(TokenKind::OpenParenthesis);
        auto& name = parseName();
        auto closeParen = expect(TokenKind::CloseParenthesis);

        IntersectClauseSyntax* intersectClause = nullptr;
        if (peek(TokenKind::IntersectKeyword)) {
            auto intersect = consume();
            auto& ranges = parseRangeList();
            intersectClause = &factory.intersectClause(intersect, ranges);
        }

        return factory.binsSelectConditionExpr(binsof, openParen, name, closeParen,
                                               intersectClause);
    };

    auto parseMatches = [&] {
        MatchesClauseSyntax* matchesClause = nullptr;
        if (peek(TokenKind::MatchesKeyword)) {
            auto matches = consume();
            auto& matchExpr = parseSubExpression(ExpressionOptions::BinsSelectContext, 0);
            matchesClause = &factory.matchesClause(matches, factory.expressionPattern(matchExpr));
        }
        return matchesClause;
    };

    BinsSelectExpressionSyntax* result;
    switch (peek().kind) {
        case TokenKind::BinsOfKeyword:
            result = &parseCondition();
            break;
        case TokenKind::Exclamation: {
            auto op = consume();
            result = &factory.unaryBinsSelectExpr(op, parseCondition());
            break;
        }
        case TokenKind::OpenParenthesis: {
            auto openParen = consume();
            auto& expr = parseBinsSelectExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            result = &factory.parenthesizedBinsSelectExpr(openParen, expr, closeParen);
            break;
        }
        default: {
            auto& expr = parseSubExpression(ExpressionOptions::BinsSelectContext, 0);
            auto matches = parseMatches();
            result = &factory.simpleBinsSelectExpr(expr, matches);
            break;
        }
    }

    if (peek(TokenKind::WithKeyword)) {
        auto with = consume();
        auto openParen = expect(TokenKind::OpenParenthesis);
        auto& expr = parseExpression();
        auto closeParen = expect(TokenKind::CloseParenthesis);
        auto matches = parseMatches();
        result = &factory.binSelectWithFilterExpr(*result, with, openParen, expr, closeParen,
                                                  matches);
    }

    return *result;
}